

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O1

void QuackFunction::QuackFunc(ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  long lVar1;
  long lVar2;
  Value *pVVar3;
  ulong uVar4;
  Value *pVVar5;
  bool bVar6;
  Value local_70 [64];
  
  duckdb::optional_ptr<const_duckdb::FunctionData,_true>::CheckValid
            ((optional_ptr<const_duckdb::FunctionData,_true> *)data_p);
  lVar1 = *(long *)data_p;
  duckdb::optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid
            ((optional_ptr<duckdb::GlobalTableFunctionState,_true> *)(data_p + 0x10));
  lVar2 = *(long *)(data_p + 0x10);
  if (*(ulong *)(lVar2 + 8) < *(ulong *)(lVar1 + 0x20)) {
    if (*(ulong *)(lVar2 + 8) < *(ulong *)(lVar1 + 0x20)) {
      pVVar5 = (Value *)0x0;
      do {
        duckdb::Value::Value(local_70,"QUACK");
        duckdb::DataChunk::SetValue((ulong)output,0,pVVar5);
        duckdb::Value::~Value(local_70);
        uVar4 = *(long *)(lVar2 + 8) + 1;
        *(ulong *)(lVar2 + 8) = uVar4;
        pVVar3 = pVVar5 + 1;
        if (*(ulong *)(lVar1 + 0x20) <= uVar4) break;
        bVar6 = pVVar5 < (Value *)0x7ff;
        pVVar5 = pVVar3;
      } while (bVar6);
    }
    else {
      pVVar3 = (Value *)0x0;
    }
    *(Value **)(output + 0x18) = pVVar3;
  }
  return;
}

Assistant:

static void QuackFunc(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
		auto &bind_data = data_p.bind_data->Cast<QuackBindData>();
		auto &data = (QuackGlobalData &)*data_p.global_state;
		if (data.offset >= bind_data.number_of_quacks) {
			// finished returning values
			return;
		}
		// start returning values
		// either fill up the chunk or return all the remaining columns
		idx_t count = 0;
		while (data.offset < bind_data.number_of_quacks && count < STANDARD_VECTOR_SIZE) {
			output.SetValue(0, count, Value("QUACK"));
			data.offset++;
			count++;
		}
		output.SetCardinality(count);
	}